

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

void __thiscall QCalendarWidgetPrivate::updateCurrentPage(QCalendarWidgetPrivate *this,QDate date)

{
  bool bVar1;
  undefined4 uVar2;
  long lVar3;
  QItemSelectionModel *pQVar4;
  undefined1 *in_RSI;
  QCalendarWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QCalendarWidget *q;
  int col;
  int row;
  QDate maxDate;
  QDate minDate;
  QDate newDate;
  QCalendar cal;
  SelectionFlag in_stack_ffffffffffffff2c;
  QCalendarModel *in_stack_ffffffffffffff30;
  QCalendarModel *this_00;
  int in_stack_ffffffffffffff38;
  int iVar5;
  int in_stack_ffffffffffffff3c;
  int iVar6;
  QCalendarWidgetPrivate *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 local_94;
  undefined1 local_90 [8];
  QDate in_stack_ffffffffffffff78;
  undefined1 local_78 [24];
  undefined1 *local_60;
  int local_58;
  int local_54;
  undefined8 local_50;
  undefined8 local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = in_RSI;
  q_func(in_RDI);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = (undefined1 *)QtPrivate::QCalendarModel::calendar(in_stack_ffffffffffffff30);
  local_20 = local_10;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = (undefined1 *)
             QCalendarWidget::minimumDate((QCalendarWidget *)in_stack_ffffffffffffff30);
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = (undefined1 *)
             QCalendarWidget::maximumDate((QCalendarWidget *)in_stack_ffffffffffffff30);
  bVar1 = QDate::isValid((QDate *)in_stack_ffffffffffffff40);
  if (bVar1) {
    local_38 = local_20;
    lVar3 = QDate::daysTo((QDate *)&local_28);
    if (lVar3 < 0) {
      local_20 = local_28;
    }
  }
  bVar1 = QDate::isValid((QDate *)in_stack_ffffffffffffff40);
  if (bVar1) {
    local_40 = local_20;
    lVar3 = QDate::daysTo((QDate *)&local_30);
    if (0 < lVar3) {
      local_20 = local_30;
    }
  }
  local_48 = local_18;
  uVar2 = QDate::year(&local_20,local_18);
  local_50 = local_18;
  QDate::month(&local_20,local_18);
  showMonth(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
  local_54 = -1;
  local_58 = -1;
  local_60 = local_20;
  QtPrivate::QCalendarModel::cellForDate
            ((QCalendarModel *)in_RDI,in_stack_ffffffffffffff78,
             (int *)CONCAT44(uVar2,in_stack_ffffffffffffff48),(int *)in_stack_ffffffffffffff40);
  if ((local_54 != -1) && (local_58 != -1)) {
    pQVar4 = QAbstractItemView::selectionModel((QAbstractItemView *)in_stack_ffffffffffffff30);
    this_00 = in_RDI->m_model;
    iVar5 = local_54;
    iVar6 = local_58;
    QModelIndex::QModelIndex((QModelIndex *)0x51cb42);
    (**(code **)(*(long *)this_00 + 0x60))(local_78,this_00,iVar5,iVar6,local_90);
    QFlags<QItemSelectionModel::SelectionFlag>::QFlags
              ((QFlags<QItemSelectionModel::SelectionFlag> *)this_00,in_stack_ffffffffffffff2c);
    (**(code **)(*(long *)pQVar4 + 0x60))(pQVar4,local_78,local_94);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QCalendarWidgetPrivate::updateCurrentPage(QDate date)
{
    Q_Q(QCalendarWidget);
    QCalendar cal = m_model->calendar();

    QDate newDate = date;
    QDate minDate = q->minimumDate();
    QDate maxDate = q->maximumDate();
    if (minDate.isValid()&& minDate.daysTo(newDate) < 0)
        newDate = minDate;
    if (maxDate.isValid()&& maxDate.daysTo(newDate) > 0)
        newDate = maxDate;
    showMonth(newDate.year(cal), newDate.month(cal));
    int row = -1, col = -1;
    m_model->cellForDate(newDate, &row, &col);
    if (row != -1 && col != -1)
    {
        m_view->selectionModel()->setCurrentIndex(m_model->index(row, col),
                                                  QItemSelectionModel::NoUpdate);
    }
}